

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fortran_array_view.cpp
# Opt level: O1

double __thiscall
cpp_bindgen::adltest::(anonymous_namespace)::StaticHypercube<4ul>::operator()
          (StaticHypercube<4ul> *this,int indices,int indices_1,int indices_2,int indices_3)

{
  ulong *puVar1;
  out_of_range *this_00;
  long lVar2;
  long lVar3;
  bool bVar4;
  size_t element [4];
  ulong local_38 [5];
  
  puVar1 = local_38;
  local_38[0] = (ulong)(uint)indices;
  local_38[1] = (ulong)(uint)indices_1;
  local_38[2] = (ulong)(uint)indices_2;
  local_38[3] = (ulong)(uint)indices_3;
  lVar2 = 3;
  lVar3 = 0;
  do {
    if (1 < *puVar1) {
      this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
      std::out_of_range::out_of_range(this_00,"Index out of range");
      __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
    lVar3 = lVar3 + (*puVar1 << ((byte)lVar2 & 0x3f));
    puVar1 = puVar1 + 1;
    bVar4 = lVar2 != 0;
    lVar2 = lVar2 + -1;
  } while (bVar4);
  return *(double *)(*(long *)this + lVar3 * 8);
}

Assistant:

double operator()(Ts... indices) const {
                    size_t element[Rank] = {size_t(indices)...};
                    size_t index = 0;
                    for (size_t i = 0; i < Rank; ++i) {
                        if (element[i] >= 2) {
                            throw std::out_of_range("Index out of range");
                        }
                        index += (element[i] << (Rank - i - 1));
                    }
                    return data_[index];
                }